

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O0

var cs_impl::runtime_cs_ext::utc_time(vector *args)

{
  size_type sVar1;
  numeric *this;
  string *str;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> *in_RSI;
  runtime_error *in_RDI;
  any *unaff_retaddr;
  time_t t;
  runtime_error *__lhs;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  unsigned_long in_stack_ffffffffffffffb8;
  time_t local_18;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> *local_10;
  
  __lhs = in_RDI;
  local_10 = in_RSI;
  sVar1 = std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::size(in_RSI);
  if (sVar1 == 0) {
    local_18 = ::time((time_t *)0x0);
    gmtime(&local_18);
    any::make<tm,tm&>((tm *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  }
  else {
    if (sVar1 != 1) {
      str = (string *)__cxa_allocate_exception(0x28);
      std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::size(local_10);
      std::__cxx11::to_string(in_stack_ffffffffffffffb8);
      std::operator+((char *)__lhs,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
      cs::runtime_error::runtime_error(in_RDI,str);
      __cxa_throw(str,&cs::runtime_error::typeinfo,cs::runtime_error::~runtime_error);
    }
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::operator[](local_10,0);
    this = any::const_val<cs::numeric>(unaff_retaddr);
    local_18 = cs::numeric::as_integer(this);
    gmtime(&local_18);
    any::make<tm,tm&>((tm *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  }
  return (var)(proxy *)__lhs;
}

Assistant:

var utc_time(vector &args)
		{
			std::time_t t;
			switch (args.size()) {
			case 0:
				t = std::time(nullptr);
				return var::make<std::tm>(*std::gmtime(&t));
			case 1:
				t = args[0].const_val<numeric>().as_integer();
				return var::make<std::tm>(*std::gmtime(&t));
			default:
				throw cs::runtime_error(
				    "Wrong size of the arguments. Expected 0 or 1, provided " + std::to_string(args.size()));
			}
		}